

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall PhyloTree::setLeaf2NumMapFromNewick(PhyloTree *this,string *s)

{
  string *psVar1;
  char *pcVar2;
  string *in_RSI;
  string label;
  size_t end_of_label;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  string local_40 [32];
  size_t local_20;
  string *local_18;
  string *local_10;
  
  local_18 = (string *)0x0;
  local_10 = in_RSI;
  while (__first._M_current = local_18, psVar1 = (string *)std::__cxx11::string::length(),
        __first._M_current < psVar1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (((*pcVar2 == '(') ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar2 == ',')) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar2 != '(')) {
      local_20 = Tools::nextIndex(__first._M_current,(size_t)in_stack_ffffffffffffff68._M_current,
                                  (char *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff68._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffa0;
      std::__cxx11::string::string((string *)in_stack_ffffffffffffff68._M_current,local_10);
      Tools::substring(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                      );
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__first._M_current,in_stack_ffffffffffffff68._M_current);
      in_stack_ffffffffffffff60 =
           (string *)
           Tools::nextIndex(__first._M_current,(size_t)in_stack_ffffffffffffff68._M_current,
                            (char *)in_stack_ffffffffffffff60);
      local_18 = in_stack_ffffffffffffff60;
      std::__cxx11::string::~string(local_40);
    }
    else {
      local_18 = (string *)&local_18->field_0x1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(in_stack_ffffffffffffff58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff58);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (__first,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void PhyloTree::setLeaf2NumMapFromNewick(string& s) {
    // go through the string and pull out all the leaf labels:  any string between '(' and ':' or ',' and ':'
    size_t i = 0;
    while (i < s.length()) {
        // however, the first character might be the beginning of a leaf label
        if ((s[i] == '(' || s[i] == ',') && (s[i + 1] != '(')) {
            size_t end_of_label = Tools::nextIndex(s, i, ":");
            string label = Tools::substring(s, i + 1, end_of_label);
            leaf2NumMap.push_back(label);
            i = Tools::nextIndex(s, i, ",)");
        } else {
            i++;
        }
    }
    // sort the elements of leaf2NumMap
    std::sort(leaf2NumMap.begin(), leaf2NumMap.end());
}